

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O3

void __thiscall QDebugStateSaver::~QDebugStateSaver(QDebugStateSaver *this)

{
  _Head_base<0UL,_QDebugStateSaverPrivate_*,_false> _Var1;
  pointer *__ptr;
  
  QDebugStateSaverPrivate::restoreState
            ((this->d)._M_t.
             super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>
             ._M_t.
             super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>
             .super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl);
  _Var1._M_head_impl =
       (this->d)._M_t.
       super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>
       .super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (QDebugStateSaverPrivate *)0x0) {
    operator_delete(_Var1._M_head_impl,0x30);
  }
  (this->d)._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (QDebugStateSaverPrivate *)0x0;
  return;
}

Assistant:

QDebugStateSaver::~QDebugStateSaver()
{
    d->restoreState();
}